

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qladisp.cpp
# Opt level: O0

void PrintDebugStream(stringstream *debugStream)

{
  stringstream *psVar1;
  ostream *this;
  allocator<char> local_61;
  string local_60 [48];
  string local_30 [32];
  stringstream *local_10;
  stringstream *debugStream_local;
  
  local_10 = debugStream;
  std::__cxx11::stringstream::str();
  this = std::operator<<((ostream *)&std::cerr,local_30);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  std::ios::clear(local_10 + *(long *)(*(long *)local_10 + -0x18),0);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"",&local_61);
  std::__cxx11::stringstream::str((string *)psVar1);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void PrintDebugStream(std::stringstream &debugStream)
{
    std::cerr << debugStream.str() << std::endl;
    debugStream.clear();
    debugStream.str("");
}